

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff_shdr_chunk.cpp
# Opt level: O3

void __thiscall sf2cute::SFRIFFShdrChunk::Write(SFRIFFShdrChunk *this,ostream *out)

{
  int iVar1;
  undefined4 uVar2;
  long lVar3;
  pointer psVar4;
  element_type *peVar5;
  ostream *poVar6;
  SFRIFFShdrChunk *pSVar7;
  int iVar8;
  const_iterator cVar9;
  length_error *this_00;
  out_of_range *this_01;
  ulong uVar10;
  uint16_t link;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  pointer psVar15;
  bool bVar16;
  string local_68;
  ostream *local_48;
  undefined4 local_3c;
  SFRIFFShdrChunk *local_38;
  
  lVar3 = *(long *)(*(long *)out + -0x18);
  uVar2 = *(undefined4 *)(out + lVar3 + 0x1c);
  *(undefined4 *)(out + lVar3 + 0x1c) = 5;
  std::ios::clear((int)out + (int)lVar3);
  local_48 = out;
  local_3c = uVar2;
  (*(this->super_RIFFChunkInterface)._vptr_RIFFChunkInterface[2])(&local_68,this);
  RIFFChunk::WriteHeader(out,&local_68,this->size_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  psVar15 = (this->samples_->
            super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar4 = (this->samples_->
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (psVar15 != psVar4) {
    uVar14 = 0;
    do {
      peVar5 = (psVar15->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_02 = (peVar5->link_).super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if ((this_02 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (this_02->_M_use_count == 0)) {
        link = 0;
      }
      else {
        if (this_02->_M_use_count == 0) {
LAB_00112734:
          peVar11 = (element_type *)0x0;
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          iVar8 = this_02->_M_use_count;
          do {
            if (iVar8 == 0) goto LAB_00112734;
            LOCK();
            iVar1 = this_02->_M_use_count;
            bVar16 = iVar8 == iVar1;
            if (bVar16) {
              this_02->_M_use_count = iVar8 + 1;
              iVar1 = iVar8;
            }
            iVar8 = iVar1;
            UNLOCK();
          } while (!bVar16);
          if (this_02->_M_use_count == 0) {
            peVar11 = (element_type *)0x0;
          }
          else {
            peVar11 = (peVar5->link_).
                      super___weak_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
        }
        local_68._M_dataplus._M_p = (pointer)peVar11;
        cVar9 = std::
                _Hashtable<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->sample_index_map_)._M_h,(key_type *)&local_68);
        if (cVar9.
            super__Node_iterator_base<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_false>
            ._M_cur == (__node_type *)0x0) {
LAB_001128e3:
          this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
          std::out_of_range::out_of_range(this_01,"Sample has a link to an unknown sample.");
          __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
        }
        local_68._M_dataplus._M_p = (pointer)peVar11;
        cVar9 = std::
                _Hashtable<const_sf2cute::SFSample_*,_std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_std::allocator<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<const_sf2cute::SFSample_*>,_std::hash<const_sf2cute::SFSample_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->sample_index_map_)._M_h,(key_type *)&local_68);
        if (cVar9.
            super__Node_iterator_base<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_false>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_001128e3;
        }
        link = *(uint16_t *)
                ((long)cVar9.
                       super__Node_iterator_base<std::pair<const_sf2cute::SFSample_*const,_unsigned_short>,_false>
                       ._M_cur + 0x10);
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
      }
      peVar5 = (psVar15->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar10 = ((long)(peVar5->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                *(long *)&(peVar5->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data >> 1) + uVar14;
      uVar12 = peVar5->start_loop_ + uVar14;
      if (((uVar12 | uVar14 | uVar10) >> 0x20 != 0) ||
         (uVar13 = peVar5->end_loop_ + uVar14, uVar13 >> 0x20 != 0)) {
        this_00 = (length_error *)__cxa_allocate_exception(0x10);
        std::length_error::length_error(this_00,"Too many sample datapoints.");
        __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
      }
      WriteItem(local_48,&peVar5->name_,(uint32_t)uVar14,(uint32_t)uVar10,(uint32_t)uVar12,
                (uint32_t)uVar13,peVar5->sample_rate_,peVar5->original_key_,peVar5->correction_,link
                ,peVar5->type_);
      peVar5 = (psVar15->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar14 = uVar14 + ((long)(peVar5->data_).super__Vector_base<short,_std::allocator<short>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(peVar5->data_).super__Vector_base<short,_std::allocator<short>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 1) + 0x2e;
      psVar15 = psVar15 + 1;
    } while (psVar15 != psVar4);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"EOS","");
  poVar6 = local_48;
  WriteItem(local_48,&local_68,0,0,0,0,0,'\0','\0',0,0);
  pSVar7 = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((pSVar7->size_ & 1) != 0) {
    local_68._M_dataplus._M_p = local_68._M_dataplus._M_p & 0xffffffffffffff00;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_68,1);
  }
  return;
}

Assistant:

void SFRIFFShdrChunk::Write(std::ostream & out) const {
  // Save exception bits of output stream.
  const std::ios_base::iostate old_exception_bits = out.exceptions();
  // Set exception bits to get output error as an exception.
  out.exceptions(std::ios::badbit | std::ios::failbit);

  try {
    // Write the chunk header.
    RIFFChunk::WriteHeader(out, name(), size_);

    // Sample headers:
    size_t start_sample = 0;
    for (const auto & sample : samples()) {
      // Find the linked sample.
      uint16_t link_index = 0;
      if (sample->has_link()) {
        const auto & link = sample->link();
        if (sample_index_map().count(link.get()) != 0) {
          link_index = sample_index_map().at(link.get());
        }
        else {
          throw std::out_of_range("Sample has a link to an unknown sample.");
        }
      }

      // Calculate the sample indices.
      size_t end_sample = start_sample + sample->data().size();
      size_t start_loop = start_sample + sample->start_loop();
      size_t end_loop = start_sample + sample->end_loop();

      // Check the range of indices.
      if (start_sample > UINT32_MAX || end_sample > UINT32_MAX ||
          start_loop > UINT32_MAX || end_loop > UINT32_MAX) {
        throw std::length_error("Too many sample datapoints.");
      }

      // Write the sample header.
      WriteItem(out,
        sample->name(),
        uint32_t(start_sample),
        uint32_t(end_sample),
        uint32_t(start_loop),
        uint32_t(end_loop),
        sample->sample_rate(),
        sample->original_key(),
        sample->correction(),
        link_index,
        sample->type());

      // Calculate the next sample index.
      start_sample += sample->data().size() + SFSample::kTerminatorSampleLength;
    }

    // Write the last terminator item.
    WriteItem(out, "EOS", 0, 0, 0, 0, 0, 0, 0, 0, SFSampleLink(0));

    // Write a padding byte if necessary.
    if (size_ % 2 != 0) {
      InsertInt8(out, 0);
    }
  }
  catch (const std::exception &) {
    // Recover exception bits of output stream.
    out.exceptions(old_exception_bits);

    // Rethrow the exception.
    throw;
  }
}